

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitAtomicWait(PrintExpressionContents *this,AtomicWait *curr)

{
  ostream *poVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  Module *in_R8;
  Name name;
  
  poVar1 = this->o;
  Colors::outputColorCode(poVar1,"\x1b[35m");
  Colors::outputColorCode(poVar1,"\x1b[1m");
  uVar2 = (curr->expectedType).id;
  uVar4 = 2;
  if (2 < uVar2) {
    uVar4 = uVar2;
  }
  if ((uVar4 & 0xfffffffffffffffe) != 2) {
    __assert_fail("type == Type::i32 || type == Type::i64",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                  ,0x2d8,"void wasm::PrintExpressionContents::visitAtomicWait(AtomicWait *)");
  }
  poVar1 = this->o;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"memory.atomic.wait",0x12);
  pcVar3 = "HEAPF64";
  if (uVar2 < 3) {
    pcVar3 = "HEAPF32";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3 + 5,2);
  Colors::outputColorCode(this->o,"\x1b[0m");
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(curr->memory).super_IString.str._M_str;
  anon_unknown_0::printMemoryName
            ((anon_unknown_0 *)(curr->memory).super_IString.str._M_len,name,(ostream *)this->wasm,
             in_R8);
  if ((curr->offset).addr != 0) {
    poVar1 = this->o;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," offset=",8);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    return;
  }
  return;
}

Assistant:

void visitAtomicWait(AtomicWait* curr) {
    prepareColor(o);
    Type type = forceConcrete(curr->expectedType);
    assert(type == Type::i32 || type == Type::i64);
    o << "memory.atomic.wait" << (type == Type::i32 ? "32" : "64");
    restoreNormalColor(o);
    printMemoryName(curr->memory, o, wasm);
    if (curr->offset) {
      o << " offset=" << curr->offset;
    }
  }